

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.cc
# Opt level: O2

void xemmai::t_fiber::f_run<xemmai::t_debug_context>(void)

{
  t_value<xemmai::t_pointer> *a_arguments;
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  t_value<xemmai::t_slot> local_68;
  t_debug_context context;
  
  pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc60));
  context.super_t_context.v_base = (t_pvalue *)(*(long *)(in_FS_OFFSET + -0x30) + -0x10);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = context.super_t_context.v_base;
  a_arguments = *(t_value<xemmai::t_pointer> **)
                 (*(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90) + 0x10);
  context.super_t_context.v_pc = (void **)0x0;
  context.super_t_context.v_lambda = (t_object *)0x0;
  context.v_next = (t_debug_context *)0x0;
  a_arguments[3].field_0.v_integer = (intptr_t)&context;
  t_value<xemmai::t_slot>::operator()(&local_68,a_arguments);
  if (*(long *)(in_FS_OFFSET + -0x30) == *(long *)(a_arguments[1].field_0.v_integer + 0x18)) {
    lVar1 = *(long *)(in_FS_OFFSET + -0x28);
    *(t_debug_context **)(*(long *)(*(long *)(lVar1 + 0xc90) + 0x10) + 0x38) = context.v_next;
    std::mutex::lock((mutex *)(lVar1 + 0xc60));
    *(undefined8 *)(a_arguments[1].field_0.v_integer + 8) = 0;
    a_arguments[1].field_0.v_integer = 0;
    lVar1 = *(long *)(*(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc58) + 8);
    *(undefined1 *)(lVar1 + 0x70) = 0;
    puVar2 = *(undefined8 **)(lVar1 + 0x78);
    *puVar2 = local_68.super_t_slot.v_p._M_b._M_p;
    *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_slot>_2 *)(puVar2 + 1) = local_68.field_0;
    lVar1 = *(long *)(lVar1 + 0x60);
    *(long *)(*(long *)(in_FS_OFFSET + -0x28) + 0xc90) = lVar1;
    *(undefined8 *)(in_FS_OFFSET + -0x30) = *(undefined8 *)(lVar1 + 0x20);
    setcontext(lVar1 + 0x78);
    return;
  }
  __assert_fail("f_stack() == q->v_internal->v_estack.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/fiber.cc"
                ,0xa9,"static void xemmai::t_fiber::f_run() [T_context = xemmai::t_debug_context]");
}

Assistant:

void t_fiber::f_run()
{
	t_thread::v_current->v_mutex.unlock();
	auto used = f_stack() - 1;
	auto x = *used;
	f_stack__(used);
	auto q = t_thread::v_current->v_active->v_fiber;
	auto b = false;
	{
		T_context context;
		try {
			x = q->v_callable(x);
		} catch (const t_rvalue& thrown) {
			q->f_caught(thrown, nullptr);
			b = true;
			x = thrown;
		} catch (...) {
			b = true;
			x = t_throwable::f_instantiate(L"<unexpected>."sv);
		}
		assert(f_stack() == q->v_internal->v_estack.get());
	}
	t_thread::v_current->v_mutex.lock();
	q->v_internal->v_thread = nullptr;
	q->v_internal = nullptr;
	auto& p = t_thread::v_current->v_thread->v_fiber->f_as<t_fiber>();
	p.v_throw = b;
	*p.v_return = x;
	t_thread::v_current->v_active = p.v_internal;
#ifdef __unix__
	f_stack__(p.v_internal->v_estack_used);
	setcontext(&p.v_internal->v_context);
#endif
#ifdef _WIN32
	v_current = p.v_internal;
	SwitchToFiber(p.v_internal->v_handle);
#endif
}